

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learner.cc
# Opt level: O0

char * prediction_type::to_string(prediction_type_t prediction_type)

{
  prediction_type_t prediction_type_local;
  char *local_8;
  
  switch(prediction_type) {
  case scalar:
    local_8 = "scalar";
    break;
  case scalars:
    local_8 = "scalars";
    break;
  case action_scores:
    local_8 = "action_scores";
    break;
  case action_probs:
    local_8 = "action_probs";
    break;
  case multiclass:
    local_8 = "multiclass";
    break;
  case multilabels:
    local_8 = "multilabels";
    break;
  case prob:
    local_8 = "prob";
    break;
  case multiclassprobs:
    local_8 = "multiclassprobs";
    break;
  default:
    local_8 = "<unsupported>";
  }
  return local_8;
}

Assistant:

const char* to_string(prediction_type_t prediction_type)
{
  switch (prediction_type)
  {
    CASE(scalar)
    CASE(scalars)
    CASE(action_scores)
    CASE(action_probs)
    CASE(multiclass)
    CASE(multilabels)
    CASE(prob)
    CASE(multiclassprobs)
    default:
      return "<unsupported>";
  }
}